

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::
     AddVectorArgMinMaxFunctionBy<duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>,duckdb::string_t>
               (AggregateFunctionSet *fun,LogicalType *type)

{
  LogicalType *in_RCX;
  pointer this;
  vector<duckdb::LogicalType,_true> by_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_170;
  AggregateFunction local_158;
  
  ArgMaxByTypes();
  for (this = local_170.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
      this != local_170.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish; this = this + 1) {
    GetVectorArgMinMaxFunctionBy<duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>,duckdb::string_t>
              (&local_158,(duckdb *)this,type,in_RCX);
    ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
    emplace_back<duckdb::AggregateFunction>
              (&(fun->super_FunctionSet<duckdb::AggregateFunction>).functions.
                super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
               &local_158);
    AggregateFunction::~AggregateFunction(&local_158);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_170);
  return;
}

Assistant:

void AddVectorArgMinMaxFunctionBy(AggregateFunctionSet &fun, const LogicalType &type) {
	auto by_types = ArgMaxByTypes();
	for (const auto &by_type : by_types) {
#ifndef DUCKDB_SMALLER_BINARY
		fun.AddFunction(GetVectorArgMinMaxFunctionBy<OP, ARG_TYPE>(by_type, type));
#else
		fun.AddFunction(GetVectorArgMinMaxFunctionInternal<OP, string_t, string_t>(by_type, type));
#endif
	}
}